

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTricycle.cpp
# Opt level: O3

int __thiscall CTestTricycle::CreateResultFiles(CTestTricycle *this)

{
  ofstream *poVar1;
  ostream *poVar2;
  long *plVar3;
  
  poVar1 = &this->m_fsFilePose;
  std::ofstream::open((string *)poVar1,(int)this + (_S_trunc|_S_out));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"#time\t",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"robot_x\t",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"robot_y\t",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"robot_q",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->m_fsFilePose + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = &this->m_fsFileContour;
  std::ofstream::open((string *)poVar1,(int)this + 0x50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"#robot_x\t",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"robot_y\t",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->m_fsFileContour + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"#LWheel_x\t",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"LWheel_y\t",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"#FWheel_x\t",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"FWheel_y\t",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"#RWheel_x\t",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"RWheel_y\t",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"#robot_x\t",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"robot_y",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return 0;
}

Assistant:

int CTestTricycle::CreateResultFiles()
{
	/// create a file to save poses of robot center (trajectory)
	m_fsFilePose.open(m_sFilenamePose);

	/// write comment (attribute of each field)
	m_fsFilePose << "#time\t" \
		<< "robot_x\t"  << "robot_y\t"  << "robot_q" << std::endl;

	/// create a file to save polygon shapes of the robot
	m_fsFileContour.open(m_sFilenameContour);

	/// write 1st line comment
	m_fsFileContour << "#robot_x\t" << "robot_y\t" << std::endl \
		<< "#LWheel_x\t" << "LWheel_y\t" << std::endl \
		<< "#FWheel_x\t" << "FWheel_y\t" << std::endl \
		<< "#RWheel_x\t" << "RWheel_y\t" << std::endl \
		<< "#robot_x\t" << "robot_y" << std::endl << std::endl;

	// no errors
	return 0;
}